

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

void time_main<trng::lcg64_shift>(lcg64_shift *r,string *name)

{
  double dVar1;
  stringstream s;
  stringstream local_1a0 [16];
  undefined1 local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  while (name->_M_string_length < 0x20) {
    std::__cxx11::string::push_back((char)name);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,name->_M_string_length);
  time_plain<trng::lcg64_shift>(r);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  dVar1 = time_cc<trng::lcg64_shift>(r);
  std::ostream::_M_insert<double>(dVar1);
  dVar1 = time_co<trng::lcg64_shift>(r);
  std::ostream::_M_insert<double>(dVar1);
  dVar1 = time_oc<trng::lcg64_shift>(r);
  std::ostream::_M_insert<double>(dVar1);
  dVar1 = time_oo<trng::lcg64_shift>(r);
  std::ostream::_M_insert<double>(dVar1);
  dVar1 = time_canonical<trng::lcg64_shift,double>(r);
  std::ostream::_M_insert<double>(dVar1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void time_main(R &r, std::string name) {
  std::stringstream s;  // write data to stream to prevent that code gets optimized away
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  const auto res_plain = time_plain(r);
  s << res_plain;
  const auto res_cc = time_cc(r);
  s << res_cc;
  const auto res_co = time_co(r);
  s << res_co;
  const auto res_oc = time_oc(r);
  s << res_oc;
  const auto res_oo = time_oo(r);
  s << res_oo;
  const auto res_canonical = time_canonical<R, double>(r);
  s << res_canonical;
  std::cout << std::endl;
}